

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v4.cpp
# Opt level: O0

error_handler_result __thiscall
error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
::operator()(error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
             *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *first,
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *last,expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *x,context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>
                     *context)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var4;
  reference pcVar5;
  int local_b8;
  int local_b4;
  int char_count;
  int prefix_size;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  curr;
  undefined1 local_90 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string message;
  context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>
  *context_local;
  expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *x_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *first_local;
  error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
  *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"ERROR! : ");
  pcVar3 = (char *)(**(code **)(*(long *)x + 0x10))();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  boost::spirit::x3::
  expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::which((expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_90);
  std::operator+(local_90 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Error! Expecting: ");
  std::operator+(local_50,local_90 + 0x20);
  std::__cxx11::string::~string((string *)(local_90 + 0x20));
  std::__cxx11::string::~string((string *)local_90);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
  std::operator<<(poVar2,"\n");
  iter = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )first->_M_current;
  p_Var4 = boost::spirit::x3::
           expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::where(x);
  _char_count = p_Var4->_M_current;
  local_b4 = 0;
  while (bVar1 = __gnu_cxx::operator!=
                           (&iter,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&char_count), bVar1) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&iter);
    std::operator<<((ostream *)&std::cout,*pcVar5);
    local_b4 = local_b4 + 1;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&iter);
  }
  local_b8 = 0;
  while ((local_b8 < 10 &&
         (bVar1 = __gnu_cxx::operator==
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&char_count,last), !bVar1))) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&char_count);
    std::operator<<((ostream *)&std::cout,*pcVar5);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&char_count);
    local_b8 = local_b8 + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  for (; 0 < local_b4; local_b4 = local_b4 + -1) {
    std::operator<<((ostream *)&std::cout,'-');
  }
  std::operator<<((ostream *)&std::cout,"^");
  for (; 1 < local_b8; local_b8 = local_b8 + -1) {
    std::operator<<((ostream *)&std::cout,'-');
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::__cxx11::string::~string((string *)local_50);
  return fail;
}

Assistant:

x3::error_handler_result operator() (
      Iterator const& first, Iterator const& last, Exception const& x,
      Context const& context) {

      std::cout << "ERROR! : " << x.what() << "\n";
      std::string message = "Error! Expecting: " + x.which() + " here:";
      std::cout << message << "\n";

      auto curr = first;
      auto iter = x.where();

      int prefix_size = 0;
      while ( curr != iter ) {
         std::cout << *curr;
         ++prefix_size;
         ++curr;
      }

      int char_count = 0;
      for (;char_count < 10; ++char_count) {
         if (iter == last) break;
         std::cout << *iter;
         ++iter;
      }
      std::cout << "\n";
      for (; prefix_size > 0; --prefix_size) {
         std::cout << '-';
      }

      std::cout << "^";
      for (; char_count > 1; --char_count){
         std::cout << '-';
      }
      std::cout << "\n";

      return x3::error_handler_result::fail;


   }